

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepImageChannel.h
# Opt level: O3

void __thiscall
Imf_2_5::TypedDeepImageChannel<half>::initializeSampleLists(TypedDeepImageChannel<half> *this)

{
  uint *puVar1;
  size_t *psVar2;
  size_t sVar3;
  SampleCountChannel *pSVar4;
  half *phVar5;
  ulong uVar6;
  size_t sVar7;
  
  if (this->_sampleBuffer != (half *)0x0) {
    operator_delete__(this->_sampleBuffer);
  }
  this->_sampleBuffer = (half *)0x0;
  pSVar4 = DeepImageChannel::sampleCounts(&this->super_DeepImageChannel);
  puVar1 = pSVar4->_numSamples;
  pSVar4 = DeepImageChannel::sampleCounts(&this->super_DeepImageChannel);
  psVar2 = pSVar4->_sampleListPositions;
  pSVar4 = DeepImageChannel::sampleCounts(&this->super_DeepImageChannel);
  uVar6 = 0xffffffffffffffff;
  if (-1 < (long)pSVar4->_sampleBufferSize) {
    uVar6 = pSVar4->_sampleBufferSize * 2;
  }
  phVar5 = (half *)operator_new__(uVar6);
  this->_sampleBuffer = phVar5;
  (*(this->super_DeepImageChannel).super_ImageChannel._vptr_ImageChannel[9])(this);
  sVar3 = (this->super_DeepImageChannel).super_ImageChannel._numPixels;
  if (sVar3 != 0) {
    sVar7 = 0;
    do {
      this->_sampleListPointers[sVar7] = this->_sampleBuffer + psVar2[sVar7];
      if ((ulong)puVar1[sVar7] != 0) {
        memset(this->_sampleListPointers[sVar7],0,(ulong)puVar1[sVar7] * 2);
      }
      sVar7 = sVar7 + 1;
    } while (sVar3 != sVar7);
  }
  return;
}

Assistant:

void
TypedDeepImageChannel<T>::initializeSampleLists ()
{
    //
    // Allocate a new set of sample lists for this channel, and
    // construct zero-filled sample lists for the pixels.
    //

    delete [] _sampleBuffer;

    _sampleBuffer = 0;          // set to 0 to prevent double deletion
                                // in case of an exception

    const unsigned int * numSamples = sampleCounts().numSamples();
    const size_t * sampleListPositions = sampleCounts().sampleListPositions();

    _sampleBuffer = new T [sampleCounts().sampleBufferSize()];
    
    resetBasePointer();

    for (size_t i = 0; i < numPixels(); ++i)
    {
        _sampleListPointers[i] = _sampleBuffer + sampleListPositions[i];

        for (unsigned int j = 0; j < numSamples[i]; ++j)
            _sampleListPointers[i][j] = T (0);
    }
}